

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O0

void __thiscall
QMenuBar::initStyleOption(QMenuBar *this,QStyleOptionMenuItem *option,QAction *action)

{
  bool bVar1;
  QMenuBarPrivate *other;
  QPalette *pQVar2;
  ulong uVar3;
  long in_RDX;
  QIcon *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QMenuBarPrivate *d;
  undefined4 in_stack_ffffffffffffff88;
  StateFlag in_stack_ffffffffffffff8c;
  QWidget *this_00;
  QIcon local_50 [4];
  QRect local_30;
  QFontMetrics local_20 [12];
  undefined4 local_14;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RSI != (QIcon *)0x0) && (in_RDX != 0)) {
    this_00 = in_RDI;
    other = d_func((QMenuBar *)0x65b98e);
    pQVar2 = QWidget::palette(in_RDI);
    QPalette::operator=((QPalette *)(in_RSI + 5),(QPalette *)pQVar2);
    QFlags<QStyle::StateFlag>::QFlags((QFlags<QStyle::StateFlag> *)in_RDI,in_stack_ffffffffffffff8c)
    ;
    *(undefined4 *)&in_RSI[1].d = local_14;
    bVar1 = QWidget::isEnabled((QWidget *)0x65b9d0);
    if ((bVar1) && (uVar3 = QAction::isEnabled(), (uVar3 & 1) != 0)) {
      QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)(in_RSI + 1),State_Enabled)
      ;
    }
    else {
      QPalette::setCurrentColorGroup((QPalette *)(in_RSI + 5),Disabled);
    }
    QWidget::fontMetrics((QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    QFontMetrics::operator=
              ((QFontMetrics *)in_RDI,
               (QFontMetrics *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    QFontMetrics::~QFontMetrics(local_20);
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QAction> *)0x65ba4b);
    if ((((bVar1) &&
         (bVar1 = ::operator==((QPointer<QAction> *)in_RDI,
                               (QAction **)
                               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)), bVar1
         )) && (QFlags<QStyle::StateFlag>::operator|=
                          ((QFlags<QStyle::StateFlag> *)(in_RSI + 1),State_Selected),
               (other->field_0x2a0 & 1) != 0)) && (((byte)other->field_0x298 >> 1 & 1) == 0)) {
      QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)(in_RSI + 1),State_Sunken);
    }
    bVar1 = QWidget::hasFocus(this_00);
    if ((bVar1) || (bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QAction> *)0x65bae0), bVar1)
       ) {
      QFlags<QStyle::StateFlag>::operator|=
                ((QFlags<QStyle::StateFlag> *)(in_RSI + 1),State_HasFocus);
    }
    local_30 = QWidget::rect(this_00);
    *(undefined8 *)((long)&in_RSI[9].d + 4) = local_30._0_8_;
    *(undefined8 *)((long)&in_RSI[10].d + 4) = local_30._8_8_;
    *(undefined4 *)&in_RSI[8].d = 0;
    *(undefined4 *)((long)&in_RSI[8].d + 4) = 0;
    QAction::text();
    QString::operator=((QString *)in_RDI,
                       (QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    QString::~QString((QString *)0x65bb68);
    QAction::icon();
    QIcon::operator=(in_RSI,(QIcon *)other);
    QIcon::~QIcon(local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuBar::initStyleOption(QStyleOptionMenuItem *option, const QAction *action) const
{
    if (!option || !action)
        return;
    Q_D(const QMenuBar);
    option->palette = palette();
    option->state = QStyle::State_None;
    if (isEnabled() && action->isEnabled())
        option->state |= QStyle::State_Enabled;
    else
        option->palette.setCurrentColorGroup(QPalette::Disabled);
    option->fontMetrics = fontMetrics();
    if (d->currentAction && d->currentAction == action) {
        option->state |= QStyle::State_Selected;
        if (d->popupState && !d->closePopupMode)
            option->state |= QStyle::State_Sunken;
    }
    if (hasFocus() || d->currentAction)
        option->state |= QStyle::State_HasFocus;
    option->menuRect = rect();
    option->menuItemType = QStyleOptionMenuItem::Normal;
    option->checkType = QStyleOptionMenuItem::NotCheckable;
    option->text = action->text();
    option->icon = action->icon();
}